

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartResumeReliablePdu.cpp
# Opt level: O0

void __thiscall
DIS::StartResumeReliablePdu::marshal(StartResumeReliablePdu *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  StartResumeReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::marshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  ClockTime::marshal(&this->_realWorldTime,dataStream);
  ClockTime::marshal(&this->_simulationTime,dataStream);
  DataStream::operator<<(dataStream,this->_requiredReliabilityService);
  DataStream::operator<<(dataStream,this->_pad1);
  DataStream::operator<<(dataStream,this->_pad2);
  DataStream::operator<<(dataStream,this->_requestID);
  return;
}

Assistant:

void StartResumeReliablePdu::marshal(DataStream& dataStream) const
{
    SimulationManagementWithReliabilityFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _realWorldTime.marshal(dataStream);
    _simulationTime.marshal(dataStream);
    dataStream << _requiredReliabilityService;
    dataStream << _pad1;
    dataStream << _pad2;
    dataStream << _requestID;
}